

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlMarshall.c
# Opt level: O0

JL_STATUS MarshallDictionary(void *Structure,JlMarshallElement *StructDescription,
                            size_t StructDescriptionCount,JlDataObject *DictionaryObject)

{
  void *sizeFieldPtr;
  size_t sizeValue;
  JlDataObject *newObject;
  JlDataObject *childDictionary;
  JlDataObject *newListObject;
  size_t countValue;
  void *countFieldPtr;
  void *elementInStruct;
  JlMarshallElement *currentItem;
  uint32_t i;
  JL_STATUS jlStatus;
  JlDataObject *DictionaryObject_local;
  size_t StructDescriptionCount_local;
  JlMarshallElement *StructDescription_local;
  void *Structure_local;
  
  currentItem._4_4_ = JL_STATUS_SUCCESS;
  _i = DictionaryObject;
  DictionaryObject_local = (JlDataObject *)StructDescriptionCount;
  StructDescriptionCount_local = (size_t)StructDescription;
  StructDescription_local = (JlMarshallElement *)Structure;
  for (currentItem._0_4_ = 0;
      (JlDataObject *)(ulong)(uint)currentItem < DictionaryObject_local &&
      currentItem._4_4_ == JL_STATUS_SUCCESS; currentItem._0_4_ = (uint)currentItem + 1) {
    elementInStruct = (void *)(StructDescriptionCount_local + (ulong)(uint)currentItem * 0x60);
    countFieldPtr =
         (void *)((long)&StructDescription_local->Type + *(long *)((long)elementInStruct + 0x18));
    if ((*(byte *)((long)elementInStruct + 0x10) & 1) == 0) {
      if (*elementInStruct == 5) {
        newObject = (JlDataObject *)0x0;
        currentItem._4_4_ =
             JlGetObjectFromDictionaryByKey(_i,*(char **)((long)elementInStruct + 8),&newObject);
        if ((currentItem._4_4_ == JL_STATUS_NOT_FOUND) &&
           (currentItem._4_4_ = JlCreateObject(JL_DATA_TYPE_DICTIONARY,&newObject),
           currentItem._4_4_ == JL_STATUS_SUCCESS)) {
          currentItem._4_4_ =
               JlAttachObjectToDictionaryObject(_i,*(char **)((long)elementInStruct + 8),newObject);
        }
        if (currentItem._4_4_ == JL_STATUS_SUCCESS) {
          currentItem._4_4_ =
               MarshallDictionary(countFieldPtr,
                                  *(JlMarshallElement **)((long)elementInStruct + 0x50),
                                  (ulong)*(uint *)((long)elementInStruct + 0x58),newObject);
        }
      }
      else {
        RemoveExistingObjectFromDictionary(_i,*(char **)((long)elementInStruct + 8));
        sizeValue = 0;
        if ((*(byte *)((long)elementInStruct + 0x4d) & 1) == 0) {
          currentItem._4_4_ =
               MarshallObject(countFieldPtr,(JlMarshallElement *)elementInStruct,
                              (JlDataObject **)&sizeValue);
        }
        else {
          sizeFieldPtr = (void *)0x0;
          if (*(long *)((long)elementInStruct + 0x28) != 0) {
            sizeFieldPtr = (void *)JlMemoryReadCountValue
                                             ((void *)((long)&StructDescription_local->Type +
                                                      *(long *)((long)elementInStruct + 0x28)),
                                              *(size_t *)((long)elementInStruct + 0x30));
          }
          currentItem._4_4_ =
               MarshalBinaryData(countFieldPtr,(size_t)sizeFieldPtr,
                                 (JlMarshallElement *)elementInStruct,(JlDataObject **)&sizeValue);
        }
        if (currentItem._4_4_ == JL_STATUS_SUCCESS) {
          currentItem._4_4_ =
               JlAttachObjectToDictionaryObject
                         (_i,*(char **)((long)elementInStruct + 8),(JlDataObject *)sizeValue);
        }
      }
    }
    else {
      countValue = (long)&StructDescription_local->Type + *(long *)((long)elementInStruct + 0x28);
      newListObject =
           (JlDataObject *)
           JlMemoryReadCountValue((void *)countValue,*(size_t *)((long)elementInStruct + 0x30));
      RemoveExistingObjectFromDictionary(_i,*(char **)((long)elementInStruct + 8));
      childDictionary = (JlDataObject *)0x0;
      currentItem._4_4_ =
           MarshallList(countFieldPtr,(size_t)newListObject,(JlMarshallElement *)elementInStruct,
                        &childDictionary);
      if (currentItem._4_4_ == JL_STATUS_SUCCESS) {
        currentItem._4_4_ =
             JlAttachObjectToDictionaryObject
                       (_i,*(char **)((long)elementInStruct + 8),childDictionary);
      }
    }
  }
  return currentItem._4_4_;
}

Assistant:

static
JL_STATUS
    MarshallDictionary
    (
        void const*                 Structure,
        JlMarshallElement const*    StructDescription,
        size_t                      StructDescriptionCount,
        JlDataObject*               DictionaryObject
    )
{
    JL_STATUS jlStatus = JL_STATUS_SUCCESS;

    for( uint32_t i=0; i<StructDescriptionCount && JL_STATUS_SUCCESS==jlStatus; i++ )
    {
        JlMarshallElement const* currentItem = &StructDescription[i];
        void const* elementInStruct = (void*)(((uint8_t*)Structure)+currentItem->FieldOffset);

        if( currentItem->IsArray )
        {
            void const* countFieldPtr = ((uint8_t*)Structure) + currentItem->CountFieldOffset;
            size_t countValue = JlMemoryReadCountValue( countFieldPtr, currentItem->CountFieldSize );

            // Remove the list from the DictionaryObject if it already exists, as we will replace it with our
            // new object for our new list
            RemoveExistingObjectFromDictionary( DictionaryObject, currentItem->Name );

            // Marshall new list object
            JlDataObject* newListObject = NULL;
            jlStatus = MarshallList( elementInStruct, countValue, currentItem, &newListObject );
            if( JL_STATUS_SUCCESS == jlStatus )
            {
                // Attach the object to the dictionary
                jlStatus = JlAttachObjectToDictionaryObject( DictionaryObject, currentItem->Name, newListObject );
            }
        }
        else if( JL_DATA_TYPE_DICTIONARY == currentItem->Type )
        {
            // Dictionary within this dictionary. We treat this a bit differently from other objects as we
            // will allow existing items in the dictionary to remain if they are already there and not
            // referenced by the Description.

            // Get or create a new dictionary.
            JlDataObject* childDictionary = NULL;
            jlStatus = JlGetObjectFromDictionaryByKey( DictionaryObject, currentItem->Name, &childDictionary );
            if( JL_STATUS_NOT_FOUND == jlStatus )
            {
                // Create a new dictionary and attach it.
                jlStatus = JlCreateObject( JL_DATA_TYPE_DICTIONARY, &childDictionary );
                if( JL_STATUS_SUCCESS == jlStatus )
                {
                    jlStatus = JlAttachObjectToDictionaryObject( DictionaryObject, currentItem->Name, childDictionary );
                }
            }

            if( JL_STATUS_SUCCESS == jlStatus )
            {
                // childDictionary is the new dictionary we are going to marshall into.
                jlStatus = MarshallDictionary( elementInStruct, currentItem->ChildStructDescription, currentItem->ChildStructDescriptionCount, childDictionary );
            }
        }
        else
        {
            // Remove the item from the DictionaryObject if it already exists, as we will replace it with our
            // new object
            RemoveExistingObjectFromDictionary( DictionaryObject, currentItem->Name );

            // Marshall new object.
            JlDataObject* newObject = NULL;
            if( currentItem->IsBase64 )
            {
                size_t sizeValue = 0;
                if( currentItem->CountFieldOffset )
                {
                    void const* sizeFieldPtr = ((uint8_t*)Structure) + currentItem->CountFieldOffset;
                    sizeValue = JlMemoryReadCountValue( sizeFieldPtr, currentItem->CountFieldSize );
                }
                jlStatus = MarshalBinaryData( elementInStruct, sizeValue, currentItem, &newObject );
            }
            else
            {
                jlStatus = MarshallObject( elementInStruct, currentItem, &newObject );
            }
            if( JL_STATUS_SUCCESS == jlStatus )
            {
                // Attach the object to the dictionary
                jlStatus = JlAttachObjectToDictionaryObject( DictionaryObject, currentItem->Name, newObject );
            }
        }
    }

    return jlStatus;
}